

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

int Ifd_ManDsdTest33(void)

{
  uint uVar1;
  Vec_Wrd_t *__ptr;
  long lVar2;
  ulong uVar3;
  word uTruth;
  int pCounts [6];
  word local_50;
  uint local_48 [6];
  
  __ptr = Ifd_ManDsdTruths(6);
  if (0 < __ptr->nSize) {
    uVar3 = 0;
    do {
      local_50 = __ptr->pArray[uVar3];
      Ifd_ComputeSignature(local_50,(int *)local_48);
      printf("%5d :  ",uVar3 & 0xffffffff);
      lVar2 = 0;
      do {
        uVar1 = local_48[lVar2];
        printf("%2d %2d %2d   ",(ulong)(uVar1 >> 0x14 & 0xff),(ulong)(uVar1 >> 10 & 0xff),
               (ulong)(uVar1 & 0xff));
        lVar2 = lVar2 + 1;
      } while (lVar2 != 6);
      printf("  ");
      Kit_DsdPrintFromTruth((uint *)&local_50,6);
      putchar(10);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)__ptr->nSize);
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  return 1;
}

Assistant:

int Ifd_ManDsdTest33() 
{
    int nVars = 6;
    Vec_Wrd_t * vTruths = Ifd_ManDsdTruths( nVars );
    int i, v, pCounts[6];
    word uTruth;
    Vec_WrdForEachEntry( vTruths, uTruth, i )
    {
        Ifd_ComputeSignature( uTruth, pCounts );
        // print
        printf( "%5d :  ", i ); 
        for ( v = 0; v < 6; v++ )
            printf( "%2d %2d %2d   ", (pCounts[v] >> 20) & 0xFF, (pCounts[v] >> 10) & 0xFF, (pCounts[v] >> 0) & 0xFF );
        printf( "  " );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, nVars );
        printf( "\n" );
    }
    Vec_WrdFree( vTruths );
    return 1;
}